

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit(V *values,int num_keys,int data_capacity,StatAccumulator *acc,
                        LinearModel<int> *model)

{
  int *piVar1;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  LinearModel<int> *in_R8;
  int j;
  int positions_remaining;
  int actual_position;
  int predicted_position;
  int i;
  int keys_remaining;
  int last_position;
  int local_58;
  int local_54 [3];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38 [3];
  int local_2c;
  int local_28;
  int local_24;
  LinearModel<int> *local_20;
  long *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_24 = -1;
  local_2c = 0;
  local_28 = in_ESI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while( true ) {
    if (local_c <= local_2c) {
      return;
    }
    local_38[1] = 0;
    local_38[0] = local_10 + -1;
    local_3c = LinearModel<int>::predict(local_20,*(int *)(local_8 + (long)local_2c * 8));
    piVar1 = std::min<int>(local_38,&local_3c);
    piVar1 = std::max<int>(local_38 + 1,piVar1);
    local_38[2] = *piVar1;
    local_44 = local_24 + 1;
    piVar1 = std::max<int>(local_38 + 2,&local_44);
    local_40 = *piVar1;
    local_48 = local_10 - local_40;
    if (local_48 < local_28) break;
    (**(code **)(*local_18 + 0x10))(local_18,local_40,local_38[2]);
    local_24 = local_40;
    local_28 = local_28 + -1;
    local_2c = local_2c + 1;
  }
  local_40 = local_10 - local_28;
  for (local_54[2] = local_2c; local_54[2] < local_c; local_54[2] = local_54[2] + 1) {
    local_54[1] = 0;
    local_54[0] = local_10 + -1;
    local_58 = LinearModel<int>::predict(local_20,*(int *)(local_8 + (long)local_54[2] * 8));
    piVar1 = std::min<int>(local_54,&local_58);
    piVar1 = std::max<int>(local_54 + 1,piVar1);
    local_38[2] = *piVar1;
    (**(code **)(*local_18 + 0x10))(local_18,local_40,local_38[2]);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void build_node_implicit(const V* values, int num_keys,
                                  int data_capacity, StatAccumulator* acc,
                                  const LinearModel<T>* model) {
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int predicted_position = std::max(
          0, std::min(data_capacity - 1, model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = data_capacity - actual_position;
      if (positions_remaining < keys_remaining) {
        actual_position = data_capacity - keys_remaining;
        for (int j = i; j < num_keys; j++) {
          predicted_position = std::max(
              0, std::min(data_capacity - 1, model->predict(values[j].first)));
          acc->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      acc->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      keys_remaining--;
    }
  }